

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O0

void __thiscall VarBind::VarBind(VarBind *this,SortableOIDType *oid,SNMP_ERROR_STATUS error)

{
  NullType *this_00;
  SNMP_ERROR_STATUS error_local;
  SortableOIDType *oid_local;
  VarBind *this_local;
  
  OIDType::cloneOID((OIDType *)this);
  this->type = NULLTYPE;
  this_00 = (NullType *)operator_new(0x10);
  NullType::NullType(this_00);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<NullType,void>
            ((shared_ptr<BER_CONTAINER> *)&this->value,this_00);
  this->errorStatus = error;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, const std::shared_ptr<BER_CONTAINER>& value): oid(oid->cloneOID()), type(value->_type), value(value){}